

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

links_entry * insert_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  uint uVar1;
  archive_entry *paVar2;
  dev_t dVar3;
  ulong uVar4;
  ulong uVar5;
  size_t bucket;
  size_t hash;
  links_entry *le;
  archive_entry *entry_local;
  archive_entry_linkresolver *res_local;
  
  res_local = (archive_entry_linkresolver *)calloc(1,0x30);
  if ((links_entry *)res_local == (links_entry *)0x0) {
    res_local = (archive_entry_linkresolver *)0x0;
  }
  else {
    paVar2 = archive_entry_clone(entry);
    ((links_entry *)res_local)->canonical = paVar2;
    if (res->number_buckets * 2 < res->number_entries) {
      grow_hash(res);
    }
    dVar3 = archive_entry_dev(entry);
    uVar4 = archive_entry_ino64(entry);
    uVar5 = (dVar3 ^ uVar4) & res->number_buckets - 1;
    if (res->buckets[uVar5] != (links_entry *)0x0) {
      res->buckets[uVar5]->previous = (links_entry *)res_local;
    }
    res->number_entries = res->number_entries + 1;
    ((links_entry *)res_local)->next = res->buckets[uVar5];
    ((links_entry *)res_local)->previous = (links_entry *)0x0;
    res->buckets[uVar5] = (links_entry *)res_local;
    ((links_entry *)res_local)->hash = dVar3 ^ uVar4;
    uVar1 = archive_entry_nlink(entry);
    ((links_entry *)res_local)->links = uVar1 - 1;
  }
  return (links_entry *)res_local;
}

Assistant:

static struct links_entry *
insert_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry *le;
	size_t hash, bucket;

	/* Add this entry to the links cache. */
	le = calloc(1, sizeof(struct links_entry));
	if (le == NULL)
		return (NULL);
	le->canonical = archive_entry_clone(entry);

	/* If the links cache is getting too full, enlarge the hash table. */
	if (res->number_entries > res->number_buckets * 2)
		grow_hash(res);

	hash = (size_t)(archive_entry_dev(entry) ^ archive_entry_ino64(entry));
	bucket = hash & (res->number_buckets - 1);

	/* If we could allocate the entry, record it. */
	if (res->buckets[bucket] != NULL)
		res->buckets[bucket]->previous = le;
	res->number_entries++;
	le->next = res->buckets[bucket];
	le->previous = NULL;
	res->buckets[bucket] = le;
	le->hash = hash;
	le->links = archive_entry_nlink(entry) - 1;
	return (le);
}